

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegendreCorrFuncZ.cpp
# Opt level: O0

void __thiscall OpenMD::LegendreCorrFuncZ::postCorrelate(LegendreCorrFuncZ *this)

{
  reference pvVar1;
  reference pvVar2;
  reference this_00;
  long in_RDI;
  Vector<double,_3U> *this_01;
  uint j;
  uint i;
  double in_stack_ffffffffffffffd8;
  undefined4 local_10;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(uint *)(in_RDI + 0x38); local_c = local_c + 1) {
    for (local_10 = 0; local_10 < *(uint *)(in_RDI + 0xe70); local_10 = local_10 + 1) {
      pvVar1 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0xee8),(ulong)local_c);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,(ulong)local_10);
      if (0 < *pvVar2) {
        pvVar1 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0xee8),(ulong)local_c);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,(ulong)local_10);
        this_01 = (Vector<double,_3U> *)(double)*pvVar2;
        this_00 = std::
                  vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                  ::operator[]((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                                *)(in_RDI + 0xed0),(ulong)local_c);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  (this_00,(ulong)local_10);
        Vector<double,_3U>::operator/=(this_01,in_stack_ffffffffffffffd8);
      }
    }
  }
  return;
}

Assistant:

void LegendreCorrFuncZ::postCorrelate() {
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      for (unsigned int j = 0; j < nZBins_; ++j) {
        if (counts_[i][j] > 0) { histogram_[i][j] /= counts_[i][j]; }
      }
    }
  }